

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O3

void rev_inertial_acceleration(kcc_joint *joint,gc_twist *xd,joint_velocity *qd,gc_acc_twist *xdd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  joint_axis jVar5;
  vector3 *pvVar6;
  vector3 *pvVar7;
  vector3 *pvVar8;
  double dVar9;
  
  if (joint == (kcc_joint *)0x0) {
    __assert_fail("joint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0xf8,
                  "void rev_inertial_acceleration(const struct kcc_joint *, const struct gc_twist *, const joint_velocity *, struct gc_acc_twist *)"
                 );
  }
  if (xd == (gc_twist *)0x0) {
    __assert_fail("xd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0xf9,
                  "void rev_inertial_acceleration(const struct kcc_joint *, const struct gc_twist *, const joint_velocity *, struct gc_acc_twist *)"
                 );
  }
  if (qd == (joint_velocity *)0x0) {
    __assert_fail("qd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0xfa,
                  "void rev_inertial_acceleration(const struct kcc_joint *, const struct gc_twist *, const joint_velocity *, struct gc_acc_twist *)"
                 );
  }
  if (xdd == (gc_acc_twist *)0x0) {
    __assert_fail("xdd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0xfb,
                  "void rev_inertial_acceleration(const struct kcc_joint *, const struct gc_twist *, const joint_velocity *, struct gc_acc_twist *)"
                 );
  }
  pvVar6 = xd->angular_velocity;
  if (pvVar6 == (vector3 *)0x0) {
    __assert_fail("xd->angular_velocity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0xfc,
                  "void rev_inertial_acceleration(const struct kcc_joint *, const struct gc_twist *, const joint_velocity *, struct gc_acc_twist *)"
                 );
  }
  pvVar7 = xd->linear_velocity;
  if (pvVar7 == (vector3 *)0x0) {
    __assert_fail("xd->linear_velocity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0xfd,
                  "void rev_inertial_acceleration(const struct kcc_joint *, const struct gc_twist *, const joint_velocity *, struct gc_acc_twist *)"
                 );
  }
  pvVar8 = xdd->angular_acceleration;
  if (pvVar8 == (vector3 *)0x0) {
    __assert_fail("xdd->angular_acceleration",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0xfe,
                  "void rev_inertial_acceleration(const struct kcc_joint *, const struct gc_twist *, const joint_velocity *, struct gc_acc_twist *)"
                 );
  }
  if (xdd->linear_acceleration != (vector3 *)0x0) {
    jVar5 = (joint->field_1).revolute_joint.axis;
    if (jVar5 == JOINT_AXIS_Z) {
      dVar9 = *qd;
      dVar1 = (pvVar7->field_0).field_0.y;
      dVar2 = (pvVar6->field_0).field_0.x;
      dVar3 = (pvVar7->field_0).field_0.x;
      (pvVar8->field_0).field_0.x = (pvVar6->field_0).field_0.y * dVar9;
      (xdd->angular_acceleration->field_0).field_0.y = -dVar2 * dVar9;
      (xdd->angular_acceleration->field_0).field_0.z = 0.0;
      (xdd->linear_acceleration->field_0).field_0.x = dVar1 * dVar9;
      (xdd->linear_acceleration->field_0).field_0.y = -dVar3 * dVar9;
      dVar9 = 0.0;
    }
    else if (jVar5 == JOINT_AXIS_Y) {
      dVar1 = *qd;
      dVar2 = (pvVar6->field_0).field_0.x;
      dVar9 = (pvVar7->field_0).field_0.x * dVar1;
      dVar3 = (pvVar7->field_0).field_0.z;
      (pvVar8->field_0).field_0.x = -(pvVar6->field_0).field_0.z * dVar1;
      (xdd->angular_acceleration->field_0).field_0.y = 0.0;
      (xdd->angular_acceleration->field_0).field_0.z = dVar2 * dVar1;
      (xdd->linear_acceleration->field_0).field_0.x = -dVar3 * dVar1;
      (xdd->linear_acceleration->field_0).field_0.y = 0.0;
    }
    else {
      if (jVar5 != JOINT_AXIS_X) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                      ,0x129,
                      "void rev_inertial_acceleration(const struct kcc_joint *, const struct gc_twist *, const joint_velocity *, struct gc_acc_twist *)"
                     );
      }
      dVar9 = *qd;
      dVar1 = (pvVar6->field_0).field_0.z;
      dVar2 = (pvVar7->field_0).field_0.z;
      dVar3 = (pvVar6->field_0).field_0.y;
      dVar4 = (pvVar7->field_0).field_0.y;
      (pvVar8->field_0).field_0.x = 0.0;
      (xdd->angular_acceleration->field_0).field_0.y = dVar1 * dVar9;
      (xdd->angular_acceleration->field_0).field_0.z = -dVar3 * dVar9;
      (xdd->linear_acceleration->field_0).field_0.x = 0.0;
      (xdd->linear_acceleration->field_0).field_0.y = dVar2 * dVar9;
      dVar9 = -dVar4 * dVar9;
    }
    (xdd->linear_acceleration->field_0).field_0.z = dVar9;
    return;
  }
  __assert_fail("xdd->linear_acceleration",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,0xff,
                "void rev_inertial_acceleration(const struct kcc_joint *, const struct gc_twist *, const joint_velocity *, struct gc_acc_twist *)"
               );
}

Assistant:

static void rev_inertial_acceleration(
        const struct kcc_joint *joint,
        const struct gc_twist *xd,
        const joint_velocity *qd,
        struct gc_acc_twist *xdd)
{
    assert(joint);
    assert(xd);
    assert(qd);
    assert(xdd);
    assert(xd->angular_velocity);
    assert(xd->linear_velocity);
    assert(xdd->angular_acceleration);
    assert(xdd->linear_acceleration);

    // Bias acceleration
    //       w_1 x w_2       -> e.g. w_1 x [0, 0, 1]
    // w_1 x v_2 + v_1 x w_2 -> e.g. w_1 x [0, 0, 0] + v_1 x [0, 0, 1] = v_1 x [0, 0, 1]
    if (joint->revolute_joint.axis == JOINT_AXIS_X) {
        double w3m1 = xd->angular_velocity->z * qd[0];
        double w2m1 = xd->angular_velocity->y * qd[0];
        double v3m1 = xd->linear_velocity->z * qd[0];
        double v2m1 = xd->linear_velocity->y * qd[0];

        xdd->angular_acceleration->x =  0.0;
        xdd->angular_acceleration->y =  w3m1;
        xdd->angular_acceleration->z = -w2m1;
        xdd->linear_acceleration->x =  0.0;
        xdd->linear_acceleration->y =  v3m1;
        xdd->linear_acceleration->z = -v2m1;
    } else if (joint->revolute_joint.axis == JOINT_AXIS_Y) {
        double w3m2 = xd->angular_velocity->z * qd[0];
        double w1m2 = xd->angular_velocity->x * qd[0];
        double v3m2 = xd->linear_velocity->z * qd[0];
        double v1m2 = xd->linear_velocity->x * qd[0];

        xdd->angular_acceleration->x = -w3m2;
        xdd->angular_acceleration->y =  0.0;
        xdd->angular_acceleration->z =  w1m2;
        xdd->linear_acceleration->x = -v3m2;
        xdd->linear_acceleration->y =  0.0;
        xdd->linear_acceleration->z =  v1m2;
    } else if (joint->revolute_joint.axis == JOINT_AXIS_Z) {
        double w2m3 = xd->angular_velocity->y * qd[0];
        double w1m3 = xd->angular_velocity->x * qd[0];
        double v2m3 = xd->linear_velocity->y * qd[0];
        double v1m3 = xd->linear_velocity->x * qd[0];

        xdd->angular_acceleration->x =  w2m3;
        xdd->angular_acceleration->y = -w1m3;
        xdd->angular_acceleration->z =  0.0;
        xdd->linear_acceleration->x =  v2m3;
        xdd->linear_acceleration->y = -v1m3;
        xdd->linear_acceleration->z =  0.0;
    } else {
        assert(0);
    }
}